

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# norms.h
# Opt level: O0

void __thiscall icu_63::Norm::setMappingCP(Norm *this)

{
  UBool UVar1;
  int32_t iVar2;
  uint uVar3;
  int iVar4;
  UChar32 c;
  Norm *this_local;
  
  UVar1 = UnicodeString::isEmpty(this->mapping);
  if (UVar1 == '\0') {
    iVar2 = UnicodeString::length(this->mapping);
    uVar3 = UnicodeString::char32At(this->mapping,0);
    iVar4 = 2;
    if (uVar3 < 0x10000) {
      iVar4 = 1;
    }
    if (iVar2 == iVar4) {
      this->mappingCP = uVar3;
      return;
    }
  }
  this->mappingCP = -1;
  return;
}

Assistant:

void setMappingCP() {
        UChar32 c;
        if(!mapping->isEmpty() && mapping->length()==U16_LENGTH(c=mapping->char32At(0))) {
            mappingCP=c;
        } else {
            mappingCP=U_SENTINEL;
        }
    }